

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O0

CSVFormat * __thiscall csv::CSVReader::get_format(CSVFormat *__return_storage_ptr__,CSVReader *this)

{
  element_type *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  undefined1 local_19;
  CSVReader *local_18;
  CSVReader *this_local;
  CSVFormat *new_format;
  
  local_19 = 0;
  local_18 = this;
  this_local = (CSVReader *)__return_storage_ptr__;
  CSVFormat::CSVFormat(__return_storage_ptr__,&this->_format);
  this_00 = std::
            __shared_ptr_access<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->col_names);
  internals::ColNames::get_col_names_abi_cxx11_(&local_38,this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->col_names,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  __return_storage_ptr__->header = (this->_format).header;
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE CSVFormat CSVReader::get_format() const {
        CSVFormat new_format = this->_format;

        // Since users are normally not allowed to set
        // column names and header row simulatenously,
        // we will set the backing variables directly here
        new_format.col_names = this->col_names->get_col_names();
        new_format.header = this->_format.header;

        return new_format;
    }